

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_io.c
# Opt level: O0

int arkWriteParameters(ARKodeMem ark_mem,FILE *fp)

{
  FILE *in_RSI;
  long in_RDI;
  int local_4;
  
  if (in_RDI == 0) {
    arkProcessError((ARKodeMem)0x0,-0x15,"ARKode","arkWriteParameters","arkode_mem = NULL illegal.")
    ;
    local_4 = -0x15;
  }
  else {
    fprintf(in_RSI,"ARKode solver parameters:\n");
    if ((*(double *)(in_RDI + 0x170) != 0.0) || (NAN(*(double *)(in_RDI + 0x170)))) {
      fprintf(in_RSI,"  Minimum step size = %.16g\n",*(undefined8 *)(in_RDI + 0x170));
    }
    if ((*(double *)(in_RDI + 0x178) != 0.0) || (NAN(*(double *)(in_RDI + 0x178)))) {
      fprintf(in_RSI,"  Maximum step size = %.16g\n",1.0 / *(double *)(in_RDI + 0x178));
    }
    if (*(int *)(in_RDI + 0x1a8) != 0) {
      fprintf(in_RSI,"  Fixed time-stepping enabled\n");
    }
    if (*(int *)(in_RDI + 0x18) == 2) {
      fprintf(in_RSI,"  User provided error weight function\n");
    }
    else {
      fprintf(in_RSI,"  Solver relative tolerance = %.16g\n",*(undefined8 *)(in_RDI + 0x20));
      if (*(int *)(in_RDI + 0x18) == 0) {
        fprintf(in_RSI,"  Solver absolute tolerance = %.16g\n",*(undefined8 *)(in_RDI + 0x28));
      }
      else {
        fprintf(in_RSI,"  Vector-valued solver absolute tolerance\n");
      }
    }
    if (*(int *)(in_RDI + 0x100) == 0) {
      if (*(int *)(in_RDI + 0x1c) == 2) {
        fprintf(in_RSI,"  User provided residual weight function\n");
      }
      else if (*(int *)(in_RDI + 0x1c) == 0) {
        fprintf(in_RSI,"  Absolute residual tolerance = %.16g\n",*(undefined8 *)(in_RDI + 0x40));
      }
      else {
        fprintf(in_RSI,"  Vector-valued residual absolute tolerance\n");
      }
    }
    if ((*(double *)(in_RDI + 0x160) != 0.0) || (NAN(*(double *)(in_RDI + 0x160)))) {
      fprintf(in_RSI,"  Initial step size = %.16g\n",*(undefined8 *)(in_RDI + 0x160));
    }
    fprintf(in_RSI,"\n");
    fprintf(in_RSI,"  Maximum step increase (first step) = %.16g\n",
            *(undefined8 *)(*(long *)(in_RDI + 0x1b0) + 8));
    fprintf(in_RSI,"  Step reduction factor on multiple error fails = %.16g\n",
            *(undefined8 *)(*(long *)(in_RDI + 0x1b0) + 0x10));
    fprintf(in_RSI,"  Minimum error fails before above factor is used = %i\n",
            (ulong)*(uint *)(*(long *)(in_RDI + 0x1b0) + 0x20));
    fprintf(in_RSI,"  Step reduction factor on nonlinear convergence failure = %.16g\n",
            *(undefined8 *)(*(long *)(in_RDI + 0x1b0) + 0x28));
    fprintf(in_RSI,"  Explicit safety factor = %.16g\n",
            *(undefined8 *)(*(long *)(in_RDI + 0x1b0) + 0x68));
    if (*(long *)(*(long *)(in_RDI + 0x1b0) + 0x30) == 0) {
      fprintf(in_RSI,"  Time step adaptivity method %i\n",
              (ulong)*(uint *)(*(long *)(in_RDI + 0x1b0) + 0x60));
      fprintf(in_RSI,"     Safety factor = %.16g\n",
              *(undefined8 *)(*(long *)(in_RDI + 0x1b0) + 0x70));
      fprintf(in_RSI,"     Bias factor = %.16g\n",*(undefined8 *)(*(long *)(in_RDI + 0x1b0) + 0x78))
      ;
      fprintf(in_RSI,"     Growth factor = %.16g\n",
              *(undefined8 *)(*(long *)(in_RDI + 0x1b0) + 0x80));
      fprintf(in_RSI,"     Step growth lower bound = %.16g\n",
              *(undefined8 *)(*(long *)(in_RDI + 0x1b0) + 0x88));
      fprintf(in_RSI,"     Step growth upper bound = %.16g\n",
              *(undefined8 *)(*(long *)(in_RDI + 0x1b0) + 0x90));
      fprintf(in_RSI,"     k1 = %.16g\n",*(undefined8 *)(*(long *)(in_RDI + 0x1b0) + 0x98));
      fprintf(in_RSI,"     k2 = %.16g\n",*(undefined8 *)(*(long *)(in_RDI + 0x1b0) + 0xa0));
      fprintf(in_RSI,"     k3 = %.16g\n",*(undefined8 *)(*(long *)(in_RDI + 0x1b0) + 0xa8));
      if (*(code **)(*(long *)(in_RDI + 0x1b0) + 0xc0) == arkExpStab) {
        fprintf(in_RSI,"  Default explicit stability function\n");
      }
      else {
        fprintf(in_RSI,"  User provided explicit stability function\n");
      }
    }
    else {
      fprintf(in_RSI,"  User provided time step adaptivity function\n");
    }
    fprintf(in_RSI,"  Maximum number of error test failures = %i\n",(ulong)*(uint *)(in_RDI + 0x1c8)
           );
    fprintf(in_RSI,"  Maximum number of convergence test failures = %i\n",
            (ulong)*(uint *)(in_RDI + 0x1cc));
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int arkWriteParameters(ARKodeMem ark_mem, FILE *fp)
{
  if (ark_mem==NULL) {
    arkProcessError(NULL, ARK_MEM_NULL, "ARKode",
                    "arkWriteParameters", MSG_ARK_NO_MEM);
    return(ARK_MEM_NULL);
  }

  /* print integrator parameters to file */
  fprintf(fp, "ARKode solver parameters:\n");
  if (ark_mem->hmin != ZERO)
    fprintf(fp, "  Minimum step size = %" RSYM"\n",ark_mem->hmin);
  if (ark_mem->hmax_inv != ZERO)
    fprintf(fp, "  Maximum step size = %" RSYM"\n",ONE/ark_mem->hmax_inv);
  if (ark_mem->fixedstep)
    fprintf(fp, "  Fixed time-stepping enabled\n");
  if (ark_mem->itol == ARK_WF) {
    fprintf(fp, "  User provided error weight function\n");
  } else {
    fprintf(fp, "  Solver relative tolerance = %" RSYM"\n", ark_mem->reltol);
    if (ark_mem->itol == ARK_SS) {
      fprintf(fp, "  Solver absolute tolerance = %" RSYM"\n", ark_mem->Sabstol);
    } else {
      fprintf(fp, "  Vector-valued solver absolute tolerance\n");
    }
  }
  if (!ark_mem->rwt_is_ewt) {
    if (ark_mem->ritol == ARK_WF) {
      fprintf(fp, "  User provided residual weight function\n");
    } else {
      if (ark_mem->ritol == ARK_SS) {
        fprintf(fp, "  Absolute residual tolerance = %" RSYM"\n", ark_mem->SRabstol);
      } else {
        fprintf(fp, "  Vector-valued residual absolute tolerance\n");
      }
    }
  }
  if (ark_mem->hin != ZERO)
    fprintf(fp, "  Initial step size = %" RSYM"\n",ark_mem->hin);
  fprintf(fp, "\n");
  fprintf(fp, "  Maximum step increase (first step) = %"RSYM"\n",
          ark_mem->hadapt_mem->etamx1);
  fprintf(fp, "  Step reduction factor on multiple error fails = %"RSYM"\n",
          ark_mem->hadapt_mem->etamxf);
  fprintf(fp, "  Minimum error fails before above factor is used = %i\n",
          ark_mem->hadapt_mem->small_nef);
  fprintf(fp, "  Step reduction factor on nonlinear convergence failure = %"RSYM"\n",
          ark_mem->hadapt_mem->etacf);
  fprintf(fp, "  Explicit safety factor = %"RSYM"\n",
          ark_mem->hadapt_mem->cfl);
  if (ark_mem->hadapt_mem->HAdapt == NULL) {
    fprintf(fp, "  Time step adaptivity method %i\n", ark_mem->hadapt_mem->imethod);
    fprintf(fp, "     Safety factor = %"RSYM"\n", ark_mem->hadapt_mem->safety);
    fprintf(fp, "     Bias factor = %"RSYM"\n", ark_mem->hadapt_mem->bias);
    fprintf(fp, "     Growth factor = %"RSYM"\n", ark_mem->hadapt_mem->growth);
    fprintf(fp, "     Step growth lower bound = %"RSYM"\n", ark_mem->hadapt_mem->lbound);
    fprintf(fp, "     Step growth upper bound = %"RSYM"\n", ark_mem->hadapt_mem->ubound);
    fprintf(fp, "     k1 = %"RSYM"\n", ark_mem->hadapt_mem->k1);
    fprintf(fp, "     k2 = %"RSYM"\n", ark_mem->hadapt_mem->k2);
    fprintf(fp, "     k3 = %"RSYM"\n", ark_mem->hadapt_mem->k3);
    if (ark_mem->hadapt_mem->expstab == arkExpStab) {
      fprintf(fp, "  Default explicit stability function\n");
    } else {
      fprintf(fp, "  User provided explicit stability function\n");
    }
  } else {
    fprintf(fp, "  User provided time step adaptivity function\n");
  }

  fprintf(fp, "  Maximum number of error test failures = %i\n",ark_mem->maxnef);
  fprintf(fp, "  Maximum number of convergence test failures = %i\n",ark_mem->maxncf);

  return(ARK_SUCCESS);
}